

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O1

CK_RV __thiscall Token::reAuthenticate(Token *this,ByteString *pin)

{
  bool bVar1;
  int iVar2;
  CK_RV CVar3;
  MutexLocker lock;
  ulong local_30;
  MutexLocker local_28;
  
  MutexLocker::MutexLocker(&local_28,this->tokenMutex);
  CVar3 = 5;
  if (this->sdm == (SecureDataManager *)0x0) goto LAB_00172148;
  iVar2 = (*this->token->_vptr_ObjectStoreToken[4])(this->token,&local_30);
  if ((char)iVar2 == '\0') {
    softHSMLog(3,"reAuthenticate",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/slot_mgr/Token.cpp"
               ,200,"Could not get the token flags");
    goto LAB_00172148;
  }
  bVar1 = SecureDataManager::isSOLoggedIn(this->sdm);
  if (bVar1) {
    bVar1 = SecureDataManager::reAuthenticateSO(this->sdm,pin);
    if (!bVar1) {
      local_30 = local_30 | 0x100000;
LAB_00172133:
      CVar3 = 0xa0;
      (*this->token->_vptr_ObjectStoreToken[5])();
      goto LAB_00172148;
    }
    local_30 = local_30 & 0xffffffffffefffff;
  }
  else {
    bVar1 = SecureDataManager::isUserLoggedIn(this->sdm);
    CVar3 = 0x91;
    if (!bVar1) goto LAB_00172148;
    bVar1 = SecureDataManager::reAuthenticateUser(this->sdm,pin);
    if (!bVar1) {
      local_30 = local_30 | 0x10000;
      goto LAB_00172133;
    }
    local_30 = local_30 & 0xfffffffffffeffff;
  }
  (*this->token->_vptr_ObjectStoreToken[5])();
  CVar3 = 0;
LAB_00172148:
  MutexLocker::~MutexLocker(&local_28);
  return CVar3;
}

Assistant:

CK_RV Token::reAuthenticate(ByteString& pin)
{
	CK_ULONG flags;

	// Lock access to the token
	MutexLocker lock(tokenMutex);

	if (sdm == NULL) return CKR_GENERAL_ERROR;

	// Get token flags
	if (!token->getTokenFlags(flags))
	{
		ERROR_MSG("Could not get the token flags");
		return CKR_GENERAL_ERROR;
	}

	if (sdm->isSOLoggedIn())
	{
		// Login
		if (!sdm->reAuthenticateSO(pin))
		{
			flags |= CKF_SO_PIN_COUNT_LOW;
			token->setTokenFlags(flags);
			return CKR_PIN_INCORRECT;
		}
		else
		{
			flags &= ~CKF_SO_PIN_COUNT_LOW;
			token->setTokenFlags(flags);
		}
	}
	else if (sdm->isUserLoggedIn())
	{
		// Login
		if (!sdm->reAuthenticateUser(pin))
		{
			flags |= CKF_USER_PIN_COUNT_LOW;
			token->setTokenFlags(flags);
			return CKR_PIN_INCORRECT;
		}
		else
		{
			flags &= ~CKF_USER_PIN_COUNT_LOW;
			token->setTokenFlags(flags);
		}
	}
	else
	{
		return CKR_OPERATION_NOT_INITIALIZED;
	}

	return CKR_OK;
}